

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

void __thiscall
IlmThread_2_5::anon_unknown_5::NullThreadPoolProvider::addTask(NullThreadPoolProvider *this,Task *t)

{
  Data *pDVar1;
  
  (*t->_vptr_Task[2])(t);
  pDVar1 = t->_group->_data;
  LOCK();
  (pDVar1->numPending).super___atomic_base<int>._M_i =
       (pDVar1->numPending).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pDVar1->numPending).super___atomic_base<int>._M_i == 0) {
    Semaphore::post(&pDVar1->isEmpty);
  }
  (*t->_vptr_Task[1])(t);
  return;
}

Assistant:

virtual void addTask (Task *t)
    {
        t->execute ();
        t->group()->_data->removeTask ();
        delete t;
    }